

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_valddi.cpp
# Opt level: O2

ze_result_t zesGetRasProcAddrTable(ze_api_version_t version,zes_ras_dditable_t *pDdiTable)

{
  zes_pfnRasGetConfig_t p_Var1;
  zes_pfnRasGetState_t p_Var2;
  ze_api_version_t *pzVar3;
  ze_result_t zVar4;
  
  pzVar3 = validation_layer::context;
  if (pDdiTable == (zes_ras_dditable_t *)0x0) {
    zVar4 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else {
    zVar4 = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
    if (((*validation_layer::context ^ version) < ZE_API_VERSION_1_0) &&
       ((*validation_layer::context & 0xffff) <= (version & 0xffff))) {
      p_Var1 = pDdiTable->pfnGetConfig;
      *(zes_pfnRasGetProperties_t *)(validation_layer::context + 0x328) =
           pDdiTable->pfnGetProperties;
      *(zes_pfnRasGetConfig_t *)(pzVar3 + 0x32a) = p_Var1;
      pDdiTable->pfnGetProperties = validation_layer::zesRasGetProperties;
      pDdiTable->pfnGetConfig = validation_layer::zesRasGetConfig;
      p_Var2 = pDdiTable->pfnGetState;
      *(zes_pfnRasSetConfig_t *)(pzVar3 + 0x32c) = pDdiTable->pfnSetConfig;
      *(zes_pfnRasGetState_t *)(pzVar3 + 0x32e) = p_Var2;
      pDdiTable->pfnSetConfig = validation_layer::zesRasSetConfig;
      pDdiTable->pfnGetState = validation_layer::zesRasGetState;
      return ZE_RESULT_SUCCESS;
    }
  }
  return zVar4;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zesGetRasProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    zes_ras_dditable_t* pDdiTable                   ///< [in,out] pointer to table of DDI function pointers
    )
{
    auto& dditable = validation_layer::context.zesDdiTable.Ras;

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if (ZE_MAJOR_VERSION(validation_layer::context.version) != ZE_MAJOR_VERSION(version) ||
        ZE_MINOR_VERSION(validation_layer::context.version) > ZE_MINOR_VERSION(version))
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    dditable.pfnGetProperties                            = pDdiTable->pfnGetProperties;
    pDdiTable->pfnGetProperties                          = validation_layer::zesRasGetProperties;

    dditable.pfnGetConfig                                = pDdiTable->pfnGetConfig;
    pDdiTable->pfnGetConfig                              = validation_layer::zesRasGetConfig;

    dditable.pfnSetConfig                                = pDdiTable->pfnSetConfig;
    pDdiTable->pfnSetConfig                              = validation_layer::zesRasSetConfig;

    dditable.pfnGetState                                 = pDdiTable->pfnGetState;
    pDdiTable->pfnGetState                               = validation_layer::zesRasGetState;

    return result;
}